

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O0

int main(void)

{
  int iVar1;
  nn_thread threads [100];
  int j;
  int i;
  int sb;
  
  signal(0xd,(__sighandler_t)0x1);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                           ,0x5d,1,0x20);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                 ,0x5e,iVar1,"ipc://test-shutdown.ipc");
  for (threads[99].handle._0_4_ = 0; (int)threads[99].handle != 10;
      threads[99].handle._0_4_ = (int)threads[99].handle + 1) {
    for (threads[99].handle._4_4_ = 0; threads[99].handle._4_4_ != 100;
        threads[99].handle._4_4_ = threads[99].handle._4_4_ + 1) {
      nn_thread_init((nn_thread *)&threads[(long)threads[99].handle._4_4_ + -1].handle,routine,
                     (void *)0x0);
    }
    for (threads[99].handle._4_4_ = 0; threads[99].handle._4_4_ != 100;
        threads[99].handle._4_4_ = threads[99].handle._4_4_ + 1) {
      nn_thread_term((nn_thread *)&threads[(long)threads[99].handle._4_4_ + -1].handle);
    }
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                  ,0x67,iVar1);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                           ,0x6b,1,0x50);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                 ,0x6c,iVar1,"ipc://test-shutdown.ipc");
  for (threads[99].handle._0_4_ = 0; (int)threads[99].handle != 10;
      threads[99].handle._0_4_ = (int)threads[99].handle + 1) {
    for (threads[99].handle._4_4_ = 0; threads[99].handle._4_4_ != 10;
        threads[99].handle._4_4_ = threads[99].handle._4_4_ + 1) {
      nn_thread_init((nn_thread *)&threads[(long)threads[99].handle._4_4_ + -1].handle,routine2,
                     (void *)0x0);
    }
    active = 10;
    while (active != 0) {
      nn_send(iVar1,"hello",5,1);
      nn_sleep(0);
    }
    for (threads[99].handle._4_4_ = 0; threads[99].handle._4_4_ != 10;
        threads[99].handle._4_4_ = threads[99].handle._4_4_ + 1) {
      nn_thread_term((nn_thread *)&threads[(long)threads[99].handle._4_4_ + -1].handle);
    }
  }
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_shutdown.c"
                  ,0x7c,iVar1);
  return 0;
}

Assistant:

int main ()
{

#ifndef NN_HAVE_WSL
    int sb;
    int i;
    int j;
    struct nn_thread threads [THREAD_COUNT];

    /*  Stress the shutdown algorithm. */

#if defined(SIGPIPE) && defined(SIG_IGN)
	signal (SIGPIPE, SIG_IGN);
#endif

    sb = test_socket (AF_SP, NN_PUB);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != TEST_LOOPS; ++j) {
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine, NULL);
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);

    /*  Test race condition of sending message while socket shutting down  */

    sb = test_socket (AF_SP, NN_PUSH);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != TEST_LOOPS; ++j) {
        for (i = 0; i != TEST2_THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine2, NULL);
        active = TEST2_THREAD_COUNT;

        while (active) {
            (void) nn_send (sb, "hello", 5, NN_DONTWAIT);
            nn_sleep (0);
        }

        for (i = 0; i != TEST2_THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);
#endif /* NN_HAVE_WSL */

    return 0;
}